

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O1

Diagnostics * __thiscall
slang::ast::ScriptSession::getDiagnostics(Diagnostics *__return_storage_ptr__,ScriptSession *this)

{
  pointer psVar1;
  element_type *peVar2;
  Diagnostic *pDVar3;
  Diagnostics *pDVar4;
  SourceManager *sourceManager;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  pointer psVar5;
  Diagnostics local_118;
  
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  psVar1 = (this->syntaxTrees).
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (this->syntaxTrees).
                super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    peVar2 = (psVar5->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    pDVar3 = (peVar2->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.data_;
    SmallVectorBase<slang::Diagnostic>::append<const_slang::Diagnostic_*>
              ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,pDVar3,
               pDVar3 + (peVar2->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
                        super_SmallVectorBase<slang::Diagnostic>.len);
  }
  pDVar4 = Compilation::getAllDiagnostics(&this->compilation);
  pDVar3 = (pDVar4->super_SmallVector<slang::Diagnostic,_2UL>).
           super_SmallVectorBase<slang::Diagnostic>.data_;
  SmallVectorBase<slang::Diagnostic>::append<const_slang::Diagnostic_*>
            ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,pDVar3,
             pDVar3 + (pDVar4->super_SmallVector<slang::Diagnostic,_2UL>).
                      super_SmallVectorBase<slang::Diagnostic>.len);
  EvalContext::getAllDiagnostics(&local_118,&this->evalContext);
  SmallVectorBase<slang::Diagnostic>::append<const_slang::Diagnostic_*>
            ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,
             local_118.super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.data_,
             local_118.super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.data_ +
             local_118.super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.len);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_118,
             (EVP_PKEY_CTX *)
             local_118.super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.data_);
  sourceManager = slang::syntax::SyntaxTree::getDefaultSourceManager();
  Diagnostics::sort(__return_storage_ptr__,sourceManager);
  return __return_storage_ptr__;
}

Assistant:

Diagnostics ScriptSession::getDiagnostics() {
    Diagnostics result;
    for (auto& tree : syntaxTrees)
        result.append_range(tree->diagnostics());

    result.append_range(compilation.getAllDiagnostics());
    result.append_range(evalContext.getAllDiagnostics());
    result.sort(SyntaxTree::getDefaultSourceManager());
    return result;
}